

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::remove_attribute(xml_node *this,xml_attribute *a)

{
  bool bVar1;
  xml_allocator *this_00;
  xml_allocator *alloc;
  xml_attribute *a_local;
  xml_node *this_local;
  
  if ((this->_root == (xml_node_struct *)0x0) || (a->_attr == (xml_attribute_struct *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = impl::anon_unknown_0::is_attribute_of(a->_attr,this->_root);
    if (bVar1) {
      this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(this->_root);
      bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
      if (bVar1) {
        impl::anon_unknown_0::remove_attribute(a->_attr,this->_root);
        impl::anon_unknown_0::destroy_attribute(a->_attr,this_00);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_attribute(const xml_attribute& a)
	{
		if (!_root || !a._attr) return false;
		if (!impl::is_attribute_of(a._attr, _root)) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		impl::remove_attribute(a._attr, _root);
		impl::destroy_attribute(a._attr, alloc);

		return true;
	}